

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O1

int Sfm_NodeResubSolve(Sfm_Ntk_t *p,int iNode,int f,int fRemoveOnly)

{
  uint uVar1;
  uint uVar2;
  uint iObj;
  int iVar3;
  Vec_Wrd_t *pVVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  word *pwVar8;
  Vec_Int_t *pVVar9;
  undefined4 in_register_00000014;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  word uTruth;
  timespec ts;
  
  uVar10 = CONCAT44(in_register_00000014,f);
  if ((iNode < p->nPis) || (uVar5 = (ulong)(uint)iNode, p->nObjs <= p->nPos + iNode)) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmCore.c"
                  ,0x75,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  if (f < 0) {
LAB_0051b553:
    __assert_fail("f >= 0 && f < Sfm_ObjFaninNum(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmCore.c"
                  ,0x76,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  if ((iNode < 0) || ((p->vFanins).nSize <= iNode)) goto LAB_0051b4f6;
  pVVar9 = (p->vFanins).pArray;
  uVar14 = pVVar9[uVar5].nSize;
  if ((int)uVar14 <= f) goto LAB_0051b553;
  p->nTryRemoves = p->nTryRemoves + 1;
  uVar15 = (ulong)(uint)f;
  if (p->pPars->fVeryVerbose != 0) {
    if (((p->vLevels).nSize <= iNode) || (pVVar9[uVar5].nSize <= f)) goto LAB_0051b4d7;
    uVar13 = p->vDivs->nSize;
    uVar1 = p->vNodes->nSize;
    uVar2 = (p->vLevels).pArray[uVar5];
    iObj = pVVar9[uVar5].pArray[uVar15];
    uVar6 = Sfm_ObjMffcSize(p,iObj);
    printf("%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n",uVar5
           ,(ulong)uVar2,0,(ulong)uVar1,(ulong)uVar13,(ulong)iObj,uVar10,(ulong)uVar14,(ulong)uVar6)
    ;
  }
  p->nCexes = 0;
  pVVar4 = p->vDivCexes;
  uVar14 = p->vDivs->nSize;
  if (pVVar4->nCap < (int)uVar14) {
    if (pVVar4->pArray == (word *)0x0) {
      pwVar8 = (word *)malloc((long)(int)uVar14 << 3);
    }
    else {
      pwVar8 = (word *)realloc(pVVar4->pArray,(long)(int)uVar14 << 3);
    }
    pVVar4->pArray = pwVar8;
    if (pwVar8 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    pVVar4->nCap = uVar14;
  }
  if (0 < (int)uVar14) {
    memset(pVVar4->pArray,0,(ulong)uVar14 * 8);
  }
  pVVar4->nSize = uVar14;
  p->vDivIds->nSize = 0;
  iVar7 = (p->vFanins).nSize;
  if (iVar7 <= iNode) goto LAB_0051b4f6;
  pVVar9 = (p->vFanins).pArray;
  if (pVVar9[uVar5].nSize < 1) {
    uVar14 = 0xffffffff;
  }
  else {
    uVar16 = 0;
    uVar13 = 0xffffffff;
    do {
      if ((long)pVVar9[uVar5].nSize <= (long)uVar16) goto LAB_0051b4d7;
      uVar14 = pVVar9[uVar5].pArray[uVar16];
      if (uVar15 != uVar16) {
        if (((int)uVar14 < 0) || ((p->vId2Var).nSize <= (int)uVar14)) goto LAB_0051b4d7;
        iVar7 = (p->vId2Var).pArray[uVar14];
        if (iVar7 < 1) goto LAB_0051b515;
        Vec_IntPush(p->vDivIds,iVar7);
        uVar14 = uVar13;
      }
      iVar7 = (p->vFanins).nSize;
      if (iVar7 <= iNode) goto LAB_0051b4f6;
      uVar16 = uVar16 + 1;
      pVVar9 = (p->vFanins).pArray;
      uVar13 = uVar14;
    } while ((long)uVar16 < (long)pVVar9[uVar5].nSize);
  }
  if (uVar14 == 0xffffffff) {
    __assert_fail("iFaninRem != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmCore.c"
                  ,0x87,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
  }
  if (((int)uVar14 < 0) || (p->vFixed->nSize <= (int)uVar14)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  uVar13 = 0xffffffff;
  if (p->vFixed->pArray[uVar14] != '\0') {
    if (iVar7 <= (int)uVar14) goto LAB_0051b4f6;
    if (pVVar9[uVar14].nSize == 1) {
      if (pVVar9[uVar14].nSize < 1) goto LAB_0051b4d7;
      uVar13 = *pVVar9[uVar14].pArray;
    }
  }
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  uTruth = Sfm_ComputeInterpolant(p);
  iVar7 = clock_gettime(3,(timespec *)&ts);
  if (iVar7 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar12 + lVar11;
  if (uTruth == 0x8765432187654321) {
    iVar7 = 0;
    if (((fRemoveOnly == 0) && (iVar7 = 0, p->pPars->fRrOnly == 0)) && (p->vDivs->nSize != 0)) {
      p->nTryResubs = p->nTryResubs + 1;
      do {
        uVar14 = p->vDivCexes->nSize;
        uVar16 = 0;
        if (0 < (int)uVar14) {
          uVar16 = 0;
          do {
            if (p->vDivCexes->pArray[uVar16] == 0xffffffffffffffffU >> (-(char)p->nCexes & 0x3fU)) {
              if ((long)p->vDivs->nSize <= (long)uVar16) goto LAB_0051b4d7;
              if (p->vDivs->pArray[uVar16] != uVar13) goto LAB_0051b23c;
            }
            uVar16 = uVar16 + 1;
          } while (uVar14 != uVar16);
          uVar16 = (ulong)uVar14;
        }
LAB_0051b23c:
        iVar7 = p->vDivs->nSize;
        if ((int)uVar16 == iVar7) {
          return 0;
        }
        if (iVar7 <= (int)uVar16) goto LAB_0051b4d7;
        uVar14 = p->vDivs->pArray[uVar16 & 0xffffffff];
        if (uVar14 == uVar13) {
          __assert_fail("Vec_IntEntry(p->vDivs, iVar) != iFaninSkip",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmCore.c"
                        ,0xb2,"int Sfm_NodeResubSolve(Sfm_Ntk_t *, int, int, int)");
        }
        if (((int)uVar14 < 0) || ((p->vId2Var).nSize <= (int)uVar14)) goto LAB_0051b4d7;
        iVar7 = (p->vId2Var).pArray[uVar14];
        if (iVar7 < 1) {
LAB_0051b515:
          __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmInt.h"
                        ,0xa7,"int Sfm_ObjSatVar(Sfm_Ntk_t *, int)");
        }
        Vec_IntPush(p->vDivIds,iVar7);
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar11 = 1;
        }
        else {
          lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
          lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
        }
        uTruth = Sfm_ComputeInterpolant(p);
        iVar7 = clock_gettime(3,(timespec *)&ts);
        if (iVar7 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
        }
        p->timeSat = p->timeSat + lVar12 + lVar11;
        if (uTruth != 0x8765432187654321) {
          if (uTruth == 0x1234567812345678) {
            p->nTimeOuts = p->nTimeOuts + 1;
            return 0;
          }
          goto LAB_0051b3a1;
        }
        if (p->nCexes == 0x40) {
          return 0;
        }
        iVar7 = p->vDivIds->nSize;
        if (iVar7 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
        }
        p->vDivIds->nSize = iVar7 + -1;
      } while( true );
    }
  }
  else {
    uVar16 = 0xffffffff;
    if (uTruth == 0x1234567812345678) {
      p->nTimeOuts = p->nTimeOuts + 1;
      return 0;
    }
LAB_0051b3a1:
    iVar7 = (int)uVar16;
    if (p->pPars->fVeryVerbose != 0) {
      iVar3 = (p->vFanins).nSize;
      if (iVar7 == -1) {
        if (iVar3 <= iNode) goto LAB_0051b4f6;
        pVVar9 = (p->vFanins).pArray;
        if (pVVar9[uVar5].nSize <= f) goto LAB_0051b4d7;
        printf("Node %d: Fanin %d (%d) can be removed.  ",uVar5,uVar10,
               (ulong)(uint)pVVar9[uVar5].pArray[uVar15]);
      }
      else {
        if (iVar3 <= iNode) {
LAB_0051b4f6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar9 = (p->vFanins).pArray;
        if (((pVVar9[uVar5].nSize <= f) || (iVar7 < 0)) || (p->vDivs->nSize <= iVar7))
        goto LAB_0051b4d7;
        printf("Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ",uVar5,uVar10,
               (ulong)(uint)pVVar9[uVar5].pArray[uVar15],uVar16 & 0xffffffff,
               (ulong)(uint)p->vDivs->pArray[uVar16 & 0xffffffff]);
      }
      Kit_DsdPrintFromTruth((uint *)&uTruth,p->vDivIds->nSize);
      putchar(10);
    }
    if (iVar7 == -1) {
      p->nRemoves = p->nRemoves + 1;
      iVar7 = -1;
    }
    else {
      p->nResubs = p->nResubs + 1;
      if ((iVar7 < 0) || (p->vDivs->nSize <= iVar7)) {
LAB_0051b4d7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = p->vDivs->pArray[uVar16 & 0xffffffff];
    }
    Sfm_NtkUpdate(p,iNode,f,iVar7,uTruth);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int Sfm_NodeResubSolve( Sfm_Ntk_t * p, int iNode, int f, int fRemoveOnly )
{
    int fSkipUpdate  = 0;
    int fVeryVerbose = 0;//p->pPars->fVeryVerbose && Vec_IntSize(p->vDivs) < 200;// || pNode->Id == 556;
    int i, iFanin, iVar = -1;
    int iFaninRem = -1, iFaninSkip = -1;
    word uTruth, uSign, uMask;
    abctime clk;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( f >= 0 && f < Sfm_ObjFaninNum(p, iNode) );
    p->nTryRemoves++;
    // report init stats
    if ( p->pPars->fVeryVerbose )
        printf( "%5d : Lev =%3d. Leaf =%3d.  Node =%3d.  Div=%3d.  Fanin =%4d (%d/%d). MFFC = %d\n", 
            iNode, Sfm_ObjLevel(p, iNode), 0, Vec_IntSize(p->vNodes), Vec_IntSize(p->vDivs), 
            Sfm_ObjFanin(p, iNode, f), f, Sfm_ObjFaninNum(p, iNode), Sfm_ObjMffcSize(p, Sfm_ObjFanin(p, iNode, f)) );
    // clean simulation info
    p->nCexes = 0;
    Vec_WrdFill( p->vDivCexes, Vec_IntSize(p->vDivs), 0 );
    // try removing the critical fanin
    Vec_IntClear( p->vDivIds );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( i != f )
            Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iFanin) );
        else
            iFaninRem = iFanin;
    assert( iFaninRem != -1 );
    // find fanin to skip 
    if ( Sfm_ObjIsFixed(p, iFaninRem) && Sfm_ObjFaninNum(p, iFaninRem) == 1 )
        iFaninSkip = Sfm_ObjFanin(p, iFaninRem, 0);
clk = Abc_Clock();
    uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
    // analyze outcomes
    if ( uTruth == SFM_SAT_UNDEC )
    {
        p->nTimeOuts++;
        return 0;
    }
    if ( uTruth != SFM_SAT_SAT )
        goto finish;
    if ( fRemoveOnly || p->pPars->fRrOnly || Vec_IntSize(p->vDivs) == 0 )
        return 0;

    p->nTryResubs++;
    if ( fVeryVerbose )
    {
        for ( i = 0; i < 9; i++ )
            printf( " " );
        for ( i = 0; i < Vec_IntSize(p->vDivs); i++ )
            printf( "%d", i % 10 );
        printf( "\n" );
    }
    while ( 1 ) 
    {
        if ( fVeryVerbose )
        {
            printf( "%3d: %3d ", p->nCexes, iVar );
            Vec_WrdForEachEntry( p->vDivCexes, uSign, i )
                printf( "%d", Abc_InfoHasBit((unsigned *)&uSign, p->nCexes-1) );
            printf( "\n" );
        }
        // find the next divisor to try
        uMask = (~(word)0) >> (64 - p->nCexes);
        Vec_WrdForEachEntry( p->vDivCexes, uSign, iVar )
            if ( uSign == uMask && Vec_IntEntry(p->vDivs, iVar) != iFaninSkip )
                break;
        if ( iVar == Vec_IntSize(p->vDivs) )
            return 0;
        assert( Vec_IntEntry(p->vDivs, iVar) != iFaninSkip );
        // try replacing the critical fanin
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, Vec_IntEntry(p->vDivs, iVar)) );
clk = Abc_Clock();
        uTruth = Sfm_ComputeInterpolant( p );
p->timeSat += Abc_Clock() - clk;
        // analyze outcomes
        if ( uTruth == SFM_SAT_UNDEC )
        {
            p->nTimeOuts++;
            return 0;
        }
        if ( uTruth != SFM_SAT_SAT )
            goto finish;
        if ( p->nCexes == 64 )
            return 0;
        // remove the last variable
        Vec_IntPop( p->vDivIds );
    }
finish:
    if ( p->pPars->fVeryVerbose )
    {
        if ( iVar == -1 )
            printf( "Node %d: Fanin %d (%d) can be removed.  ", iNode, f, Sfm_ObjFanin(p, iNode, f) );
        else
            printf( "Node %d: Fanin %d (%d) can be replaced by divisor %d (%d).   ", 
            iNode, f, Sfm_ObjFanin(p, iNode, f), iVar, Vec_IntEntry(p->vDivs, iVar) );
        Kit_DsdPrintFromTruth( (unsigned *)&uTruth, Vec_IntSize(p->vDivIds) ); printf( "\n" );
    }
    if ( iVar == -1 )
        p->nRemoves++;
    else
        p->nResubs++;
    if ( fSkipUpdate )
        return 0;
    // update the network
    Sfm_NtkUpdate( p, iNode, f, (iVar == -1 ? iVar : Vec_IntEntry(p->vDivs, iVar)), uTruth );
    return 1;
 }